

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

bool ON_wString::EqualPath(wchar_t *path1,int element_count1,wchar_t *path2,int element_count2)

{
  ON__UINT32 OVar1;
  ON__UINT32 OVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ON__UINT32 OVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  wchar_t null_terminator;
  wchar_t local_4c;
  wchar_t *local_48;
  ulong local_40;
  long local_38;
  
  if ((path1 == (wchar_t *)0x0 && element_count1 != 0) ||
     (element_count2 != 0 && path2 == (wchar_t *)0x0)) {
    if (path1 == (wchar_t *)0x0 || path1 == path2) {
      return path1 == path2;
    }
    if (path2 == (wchar_t *)0x0) {
      return false;
    }
  }
  local_4c = L'\0';
  if (element_count1 < 0) {
    element_count1 = Length(path1);
  }
  if (element_count2 < 0) {
    element_count2 = Length(path2);
  }
  if (element_count1 == 0) {
    path1 = &local_4c;
  }
  if (element_count2 == 0) {
    path2 = &local_4c;
  }
  bVar9 = true;
  if (element_count1 != element_count2 || path1 != path2) {
    uVar4 = element_count2;
    if (element_count1 < element_count2) {
      uVar4 = element_count1;
    }
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    else {
      local_40 = (ulong)uVar4;
      local_48 = path2;
      local_38 = (long)element_count1;
      if ((long)element_count2 < (long)element_count1) {
        local_38 = (long)element_count2;
      }
      lVar7 = 0;
      lVar8 = 0;
      do {
        OVar1 = MapCodePointOrdinal(path1[lVar8],0xffffffff,
                                    MinimumOrdinal - ((uint)(path1[lVar8] + L'\xffffffbf') < 0x3a));
        OVar6 = 0x2f;
        if (OVar1 != 0x5c) {
          OVar6 = OVar1;
        }
        OVar2 = MapCodePointOrdinal(local_48[lVar8],0xffffffff,
                                    MinimumOrdinal -
                                    ((uint)(local_48[lVar8] + L'\xffffffbf') < 0x3a));
        OVar1 = 0x2f;
        if (OVar2 != 0x5c) {
          OVar1 = OVar2;
        }
        if (OVar6 != OVar1) {
          return false;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + -4;
      } while ((int)local_38 != (int)lVar8);
      path1 = (wchar_t *)((long)path1 - lVar7);
      path2 = (wchar_t *)((long)local_48 - lVar7);
      uVar4 = (uint)local_40;
    }
    uVar5 = uVar4;
    if ((int)uVar4 < element_count1) {
      lVar7 = 0;
      do {
        if (path1[lVar7] != L'\0') {
          return false;
        }
        lVar7 = lVar7 + 1;
        uVar5 = element_count1;
      } while (element_count1 - uVar4 != (int)lVar7);
    }
    if ((int)uVar5 < element_count2) {
      lVar7 = 0;
      do {
        bVar9 = path2[lVar7] == L'\0';
        if (!bVar9) {
          return bVar9;
        }
        iVar3 = (int)lVar7;
        lVar7 = lVar7 + 1;
      } while (~uVar5 + element_count2 != iVar3);
    }
  }
  return bVar9;
}

Assistant:

bool ON_wString::EqualPath(
  const wchar_t* path1,
  int element_count1,
  const wchar_t* path2,
  int element_count2
  )
{
  WIDE_STRING_EQUAL_PREAMBLE(path1,element_count1,path2,element_count2);

  unsigned int c1=0, c2=0;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;
  int i;
  const bool bOrdinalIgnoreCase = ON_FileSystemPath::PlatformPathIgnoreCase();

  if (bOrdinalIgnoreCase)
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeWideCharPathSepartor((wchar_t)OrdinalWideCharToIgnoreCase(*path1++));
      c2 = ON_NormalizeWideCharPathSepartor((wchar_t)OrdinalWideCharToIgnoreCase(*path2++));
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeWideCharPathSepartor(*path1++);
      c2 = ON_NormalizeWideCharPathSepartor(*path2++);
      if ( c1 != c2 )
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*path1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*path2++))
      return false;
  }

  return true;
}